

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

char * Diligent::Parsing::SkipDelimiters<char_const*>(char **Start,char **End,char *Delimiters)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  byte *pbVar4;
  
  pbVar4 = (byte *)*Start;
  pbVar1 = (byte *)*End;
  pbVar2 = pbVar4;
  if (Delimiters == (char *)0x0) {
    while (((pbVar2 != pbVar1 && (pbVar4 = pbVar2, (ulong)*pbVar2 < 0x21)) &&
           ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar4 = pbVar1;
      pbVar2 = pbVar2 + 1;
    }
  }
  else {
    while ((pbVar2 != pbVar1 &&
           (pcVar3 = strchr(Delimiters,(int)(char)*pbVar2), pbVar4 = pbVar2, pcVar3 != (char *)0x0))
          ) {
      pbVar4 = pbVar1;
      pbVar2 = pbVar2 + 1;
    }
  }
  return (char *)pbVar4;
}

Assistant:

InteratorType SkipDelimiters(const InteratorType& Start, const InteratorType& End, const char* Delimiters = nullptr) noexcept
{
    auto Pos = Start;
    if (Delimiters != nullptr)
    {
        while (Pos != End && strchr(Delimiters, *Pos))
            ++Pos;
    }
    else
    {
        while (Pos != End && IsDelimiter(*Pos))
            ++Pos;
    }
    return Pos;
}